

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexPlaneCollisionAlgorithm.cpp
# Opt level: O1

void __thiscall
cbtConvexPlaneCollisionAlgorithm::processCollision
          (cbtConvexPlaneCollisionAlgorithm *this,cbtCollisionObjectWrapper *body0Wrap,
          cbtCollisionObjectWrapper *body1Wrap,cbtDispatcherInfo *dispatchInfo,
          cbtManifoldResult *resultOut)

{
  cbtScalar cVar1;
  cbtScalar cVar2;
  cbtScalar cVar3;
  cbtScalar cVar4;
  cbtScalar cVar5;
  cbtScalar cVar6;
  uint uVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  cbtCollisionShape *pcVar14;
  cbtCollisionShape *pcVar15;
  cbtTransform *pcVar16;
  cbtPersistentManifold *this_00;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  cbtCollisionObjectWrapper *pcVar32;
  cbtCollisionObject *pcVar33;
  int iVar34;
  cbtCollisionObject *pcVar35;
  cbtDispatcherInfo *dispatchInfo_00;
  int iVar36;
  cbtCollisionObjectWrapper *pcVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  cbtScalar cVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  cbtScalar acVar48 [4];
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  cbtVector3 normalOnSurfaceB;
  float local_ec;
  float local_e4;
  float local_e0;
  cbtQuadWord local_80;
  uint local_70;
  float local_6c;
  uint local_68;
  uint local_60;
  float local_5c;
  uint uStack_58;
  float local_50;
  float local_4c;
  float local_48;
  undefined1 local_40 [16];
  undefined1 extraout_var [60];
  
  if (this->m_manifoldPtr != (cbtPersistentManifold *)0x0) {
    pcVar37 = body1Wrap;
    pcVar32 = body0Wrap;
    if (this->m_isSwapped != false) {
      pcVar37 = body0Wrap;
      pcVar32 = body1Wrap;
    }
    pcVar14 = pcVar32->m_shape;
    pcVar15 = pcVar37->m_shape;
    dispatchInfo_00 = (cbtDispatcherInfo *)resultOut;
    cbtTransform::inverse(pcVar32->m_worldTransform);
    pcVar16 = pcVar37->m_worldTransform;
    fVar46 = (pcVar16->m_basis).m_el[1].m_floats[0];
    cVar1 = (pcVar16->m_basis).m_el[0].m_floats[0];
    cVar2 = (pcVar16->m_basis).m_el[0].m_floats[1];
    auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar46 * local_80.m_floats[1])),ZEXT416((uint)cVar1),
                              ZEXT416((uint)local_80.m_floats[0]));
    cVar3 = (pcVar16->m_basis).m_el[2].m_floats[0];
    auVar42 = vfmadd231ss_fma(auVar42,ZEXT416((uint)cVar3),ZEXT416((uint)local_80.m_floats[2]));
    fVar45 = (pcVar16->m_basis).m_el[1].m_floats[1];
    auVar51 = vfmadd231ss_fma(ZEXT416((uint)(local_80.m_floats[1] * fVar45)),ZEXT416((uint)cVar2),
                              ZEXT416((uint)local_80.m_floats[0]));
    cVar4 = (pcVar16->m_basis).m_el[2].m_floats[1];
    auVar51 = vfmadd231ss_fma(auVar51,ZEXT416((uint)cVar4),ZEXT416((uint)local_80.m_floats[2]));
    cVar5 = (pcVar16->m_basis).m_el[0].m_floats[2];
    fVar44 = (pcVar16->m_basis).m_el[1].m_floats[2];
    auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar44 * local_80.m_floats[1])),ZEXT416((uint)cVar5),
                              ZEXT416((uint)local_80.m_floats[0]));
    cVar6 = (pcVar16->m_basis).m_el[2].m_floats[2];
    auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)cVar6),ZEXT416((uint)local_80.m_floats[2]));
    auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar46 * local_6c)),ZEXT416((uint)cVar1),
                              ZEXT416(local_70));
    auVar22 = vfmadd231ss_fma(auVar22,ZEXT416((uint)cVar3),ZEXT416(local_68));
    auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar45 * local_6c)),ZEXT416((uint)cVar2),
                              ZEXT416(local_70));
    auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)cVar4),ZEXT416(local_68));
    auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar44 * local_6c)),ZEXT416((uint)cVar5),
                              ZEXT416(local_70));
    auVar24 = vfmadd231ss_fma(auVar24,ZEXT416((uint)cVar6),ZEXT416(local_68));
    auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar46 * local_5c)),ZEXT416(local_60),
                              ZEXT416((uint)cVar1));
    auVar49 = vfmadd231ss_fma(auVar49,ZEXT416(uStack_58),ZEXT416((uint)cVar3));
    auVar52 = vfmadd231ss_fma(ZEXT416((uint)(fVar45 * local_5c)),ZEXT416(local_60),
                              ZEXT416((uint)cVar2));
    auVar52 = vfmadd231ss_fma(auVar52,ZEXT416(uStack_58),ZEXT416((uint)cVar4));
    auVar53 = vfmadd231ss_fma(ZEXT416((uint)(fVar44 * local_5c)),ZEXT416((uint)cVar5),
                              ZEXT416(local_60));
    auVar53 = vfmadd231ss_fma(auVar53,ZEXT416((uint)cVar6),ZEXT416(uStack_58));
    cbtTransform::inverse(pcVar16);
    pcVar16 = pcVar32->m_worldTransform;
    fVar46 = (pcVar16->m_basis).m_el[1].m_floats[0];
    cVar1 = (pcVar16->m_basis).m_el[0].m_floats[0];
    cVar2 = (pcVar16->m_basis).m_el[0].m_floats[1];
    auVar54 = vfmadd231ss_fma(ZEXT416((uint)(fVar46 * local_80.m_floats[1])),ZEXT416((uint)cVar1),
                              ZEXT416((uint)local_80.m_floats[0]));
    cVar3 = (pcVar16->m_basis).m_el[2].m_floats[0];
    auVar54 = vfmadd231ss_fma(auVar54,ZEXT416((uint)cVar3),ZEXT416((uint)local_80.m_floats[2]));
    fVar45 = (pcVar16->m_basis).m_el[1].m_floats[1];
    auVar25 = vfmadd231ss_fma(ZEXT416((uint)(local_80.m_floats[1] * fVar45)),ZEXT416((uint)cVar2),
                              ZEXT416((uint)local_80.m_floats[0]));
    cVar4 = (pcVar16->m_basis).m_el[2].m_floats[1];
    auVar25 = vfmadd231ss_fma(auVar25,ZEXT416((uint)cVar4),ZEXT416((uint)local_80.m_floats[2]));
    cVar5 = (pcVar16->m_basis).m_el[0].m_floats[2];
    fVar44 = (pcVar16->m_basis).m_el[1].m_floats[2];
    auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar44 * local_80.m_floats[1])),ZEXT416((uint)cVar5),
                              ZEXT416((uint)local_80.m_floats[0]));
    cVar6 = (pcVar16->m_basis).m_el[2].m_floats[2];
    auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)cVar6),ZEXT416((uint)local_80.m_floats[2]));
    auVar27 = vfmadd231ss_fma(ZEXT416((uint)(local_6c * fVar46)),ZEXT416((uint)cVar1),
                              ZEXT416(local_70));
    auVar27 = vfmadd231ss_fma(auVar27,ZEXT416((uint)cVar3),ZEXT416(local_68));
    auVar28 = vfmadd231ss_fma(ZEXT416((uint)(local_6c * fVar45)),ZEXT416((uint)cVar2),
                              ZEXT416(local_70));
    auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)cVar4),ZEXT416(local_68));
    auVar29 = vfmadd231ss_fma(ZEXT416((uint)(fVar44 * local_6c)),ZEXT416((uint)cVar5),
                              ZEXT416(local_70));
    auVar29 = vfmadd231ss_fma(auVar29,ZEXT416((uint)cVar6),ZEXT416(local_68));
    auVar38 = vmulss_avx512f(ZEXT416((uint)fVar46),ZEXT416((uint)local_5c));
    auVar38 = vfmadd231ss_avx512f(auVar38,ZEXT416(local_60),ZEXT416((uint)cVar1));
    auVar39 = vfmadd231ss_avx512f(auVar38,ZEXT416(uStack_58),ZEXT416((uint)cVar3));
    auVar38 = vmulss_avx512f(ZEXT416((uint)fVar45),ZEXT416((uint)local_5c));
    auVar38 = vfmadd231ss_fma(auVar38,ZEXT416(local_60),ZEXT416((uint)cVar2));
    auVar38 = vfmadd231ss_fma(auVar38,ZEXT416(uStack_58),ZEXT416((uint)cVar4));
    auVar40 = vmulss_avx512f(ZEXT416((uint)fVar44),ZEXT416((uint)local_5c));
    auVar40 = vfmadd231ss_fma(auVar40,ZEXT416(local_60),ZEXT416((uint)cVar5));
    auVar40 = vfmadd231ss_fma(auVar40,ZEXT416(uStack_58),ZEXT416((uint)cVar6));
    cVar1 = (pcVar16->m_origin).m_floats[0];
    fVar46 = (pcVar16->m_origin).m_floats[1];
    auVar30 = vfmadd231ss_fma(ZEXT416((uint)(local_80.m_floats[1] * fVar46)),ZEXT416((uint)cVar1),
                              ZEXT416((uint)local_80.m_floats[0]));
    cVar2 = (pcVar16->m_origin).m_floats[2];
    auVar30 = vfmadd231ss_fma(auVar30,ZEXT416((uint)cVar2),ZEXT416((uint)local_80.m_floats[2]));
    auVar31 = vfmadd231ss_fma(ZEXT416((uint)(local_6c * fVar46)),ZEXT416((uint)cVar1),
                              ZEXT416(local_70));
    auVar31 = vfmadd231ss_fma(auVar31,ZEXT416((uint)cVar2),ZEXT416(local_68));
    auVar41 = vmulss_avx512f(ZEXT416((uint)local_5c),ZEXT416((uint)fVar46));
    auVar41 = vfmadd231ss_fma(auVar41,ZEXT416((uint)cVar1),ZEXT416(local_60));
    auVar41 = vfmadd231ss_fma(auVar41,ZEXT416((uint)cVar2),ZEXT416(uStack_58));
    uVar7 = *(uint *)&pcVar15[2]._vptr_cbtCollisionShape;
    fVar46 = *(float *)((long)&pcVar15[2]._vptr_cbtCollisionShape + 4);
    uVar8 = pcVar15[2].m_shapeType;
    auVar42 = vfnmsub231ss_fma(ZEXT416((uint)(fVar46 * auVar51._0_4_)),ZEXT416(uVar7),
                               ZEXT416(auVar42._0_4_));
    auVar42 = vfnmadd231ss_fma(auVar42,ZEXT416(uVar8),ZEXT416(auVar21._0_4_));
    auVar51 = vfnmsub231ss_fma(ZEXT416((uint)(fVar46 * auVar23._0_4_)),ZEXT416(uVar7),
                               ZEXT416(auVar22._0_4_));
    auVar51 = vfnmadd231ss_fma(auVar51,ZEXT416(uVar8),ZEXT416(auVar24._0_4_));
    auVar42 = vinsertps_avx(auVar42,auVar51,0x10);
    auVar51 = vfnmsub231ss_fma(ZEXT416((uint)(fVar46 * auVar52._0_4_)),ZEXT416(uVar7),
                               ZEXT416(auVar49._0_4_));
    auVar51 = vfnmadd231ss_fma(auVar51,ZEXT416(uVar8),ZEXT416(auVar53._0_4_));
    acVar48 = (cbtScalar  [4])vinsertps_avx(auVar42,auVar51,0x28);
    local_80.m_floats = acVar48;
    (*pcVar14->_vptr_cbtCollisionShape[0x10])(pcVar14,&local_80);
    auVar42 = vmovshdup_avx((undefined1  [16])acVar48);
    fVar46 = auVar42._0_4_;
    auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar46 * auVar25._0_4_)),(undefined1  [16])acVar48,
                              ZEXT416(auVar54._0_4_));
    auVar42 = vfmadd231ss_fma(auVar42,auVar51,ZEXT416(auVar26._0_4_));
    fVar17 = auVar42._0_4_ + auVar30._0_4_ + local_50;
    auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar46 * auVar28._0_4_)),(undefined1  [16])acVar48,
                              ZEXT416(auVar27._0_4_));
    auVar42 = vfmadd231ss_fma(auVar42,auVar51,ZEXT416(auVar29._0_4_));
    fVar18 = auVar42._0_4_ + auVar31._0_4_ + local_4c;
    auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar46 * auVar38._0_4_)),(undefined1  [16])acVar48,
                              ZEXT416(auVar39._0_4_));
    auVar42 = vfmadd231ss_fma(auVar42,auVar51,ZEXT416(auVar40._0_4_));
    fVar19 = auVar42._0_4_ + auVar41._0_4_ + local_48;
    fVar46 = *(float *)&pcVar15[2]._vptr_cbtCollisionShape;
    fVar45 = *(float *)((long)&pcVar15[2]._vptr_cbtCollisionShape + 4);
    auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar45 * fVar18)),ZEXT416((uint)fVar46),
                              ZEXT416((uint)fVar17));
    fVar44 = (float)pcVar15[2].m_shapeType;
    auVar42 = vfmadd231ss_fma(auVar42,ZEXT416((uint)fVar44),ZEXT416((uint)fVar19));
    fVar20 = auVar42._0_4_ - *(float *)&pcVar15[2].m_userPointer;
    pcVar16 = pcVar37->m_worldTransform;
    cVar1 = (pcVar16->m_basis).m_el[0].m_floats[0];
    fVar9 = (pcVar16->m_basis).m_el[0].m_floats[1];
    cVar2 = (pcVar16->m_basis).m_el[0].m_floats[2];
    cVar3 = (pcVar16->m_basis).m_el[1].m_floats[0];
    fVar10 = (pcVar16->m_basis).m_el[1].m_floats[1];
    cVar4 = (pcVar16->m_basis).m_el[1].m_floats[2];
    cVar5 = (pcVar16->m_basis).m_el[2].m_floats[0];
    fVar47 = (pcVar16->m_basis).m_el[2].m_floats[1];
    cVar6 = (pcVar16->m_basis).m_el[2].m_floats[2];
    fVar11 = (pcVar16->m_origin).m_floats[0];
    fVar12 = (pcVar16->m_origin).m_floats[1];
    fVar13 = (pcVar16->m_origin).m_floats[2];
    cVar43 = cbtPersistentManifold::getContactBreakingThreshold(this->m_manifoldPtr);
    resultOut->m_manifoldPtr = this->m_manifoldPtr;
    if (fVar20 < cVar43 + resultOut->m_closestPointDistanceThreshold) {
      fVar19 = fVar19 - fVar20 * fVar44;
      fVar17 = fVar17 - fVar20 * fVar46;
      fVar18 = fVar18 - fVar20 * fVar45;
      auVar42 = vfmadd213ss_fma(ZEXT416((uint)cVar5),ZEXT416((uint)fVar17),
                                ZEXT416((uint)(fVar18 * fVar47)));
      auVar51 = vfmadd213ss_fma(ZEXT416((uint)cVar6),ZEXT416((uint)fVar19),auVar42);
      auVar42 = vfmadd213ss_fma(ZEXT416((uint)cVar1),ZEXT416((uint)fVar17),
                                ZEXT416((uint)(fVar18 * fVar9)));
      auVar42 = vfmadd213ss_fma(ZEXT416((uint)cVar2),ZEXT416((uint)fVar19),auVar42);
      auVar21 = vfmadd213ss_fma(ZEXT416((uint)cVar3),ZEXT416((uint)fVar17),
                                ZEXT416((uint)(fVar18 * fVar10)));
      auVar21 = vfmadd213ss_fma(ZEXT416((uint)cVar4),ZEXT416((uint)fVar19),auVar21);
      auVar42 = vinsertps_avx(ZEXT416((uint)(auVar42._0_4_ + fVar11)),
                              ZEXT416((uint)(auVar21._0_4_ + fVar12)),0x10);
      local_40 = vinsertps_avx(auVar42,ZEXT416((uint)(auVar51._0_4_ + fVar13)),0x28);
      pcVar16 = pcVar37->m_worldTransform;
      uVar7 = *(uint *)&pcVar15[2]._vptr_cbtCollisionShape;
      fVar46 = *(float *)((long)&pcVar15[2]._vptr_cbtCollisionShape + 4);
      auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar46 * (pcVar16->m_basis).m_el[0].m_floats[1])),
                                ZEXT416(uVar7),ZEXT416((uint)(pcVar16->m_basis).m_el[0].m_floats[0])
                               );
      uVar8 = pcVar15[2].m_shapeType;
      auVar42 = vfmadd231ss_fma(auVar42,ZEXT416(uVar8),
                                ZEXT416((uint)(pcVar16->m_basis).m_el[0].m_floats[2]));
      auVar51 = vfmadd231ss_fma(ZEXT416((uint)(fVar46 * (pcVar16->m_basis).m_el[1].m_floats[1])),
                                ZEXT416(uVar7),ZEXT416((uint)(pcVar16->m_basis).m_el[1].m_floats[0])
                               );
      auVar51 = vfmadd231ss_fma(auVar51,ZEXT416(uVar8),
                                ZEXT416((uint)(pcVar16->m_basis).m_el[1].m_floats[2]));
      auVar42 = vinsertps_avx(auVar42,auVar51,0x10);
      auVar51 = vfmadd231ss_fma(ZEXT416((uint)(fVar46 * (pcVar16->m_basis).m_el[2].m_floats[1])),
                                ZEXT416(uVar7),ZEXT416((uint)(pcVar16->m_basis).m_el[2].m_floats[0])
                               );
      auVar51 = vfmadd231ss_fma(auVar51,ZEXT416(uVar8),
                                ZEXT416((uint)(pcVar16->m_basis).m_el[2].m_floats[2]));
      local_80.m_floats = (cbtScalar  [4])vinsertps_avx(auVar42,auVar51,0x28);
      (*(resultOut->super_Result)._vptr_Result[4])((ulong)(uint)fVar20,resultOut);
    }
    if ((pcVar14->m_shapeType < 7) &&
       (resultOut->m_manifoldPtr->m_cachedPoints < this->m_minimumPointsPerturbationThreshold)) {
      fVar46 = (float)pcVar15[2].m_shapeType;
      auVar42._8_4_ = 0x7fffffff;
      auVar42._0_8_ = 0x7fffffff7fffffff;
      auVar42._12_4_ = 0x7fffffff;
      auVar42 = vandps_avx512vl(ZEXT416((uint)fVar46),auVar42);
      if (auVar42._0_4_ <= 0.70710677) {
        fVar46 = *(float *)((long)&pcVar15[2]._vptr_cbtCollisionShape + 4);
        auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar46 * fVar46)),
                                  ZEXT416(*(uint *)&pcVar15[2]._vptr_cbtCollisionShape),
                                  ZEXT416(*(uint *)&pcVar15[2]._vptr_cbtCollisionShape));
        if (auVar42._0_4_ < 0.0) {
          fVar46 = sqrtf(auVar42._0_4_);
        }
        else {
          auVar42 = vsqrtss_avx(auVar42,auVar42);
          fVar46 = auVar42._0_4_;
        }
        auVar51._8_4_ = 0x80000000;
        auVar51._0_8_ = 0x8000000080000000;
        auVar51._12_4_ = 0x80000000;
        auVar42 = vxorps_avx512vl(ZEXT416(*(uint *)((long)&pcVar15[2]._vptr_cbtCollisionShape + 4)),
                                  auVar51);
        local_e0 = (1.0 / fVar46) * auVar42._0_4_;
        local_e4 = (1.0 / fVar46) * *(float *)&pcVar15[2]._vptr_cbtCollisionShape;
        local_ec = 0.0;
      }
      else {
        auVar42 = ZEXT416(*(uint *)((long)&pcVar15[2]._vptr_cbtCollisionShape + 4));
        auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar46 * fVar46)),auVar42,auVar42);
        if (auVar42._0_4_ < 0.0) {
          fVar46 = sqrtf(auVar42._0_4_);
        }
        else {
          auVar42 = vsqrtss_avx(auVar42,auVar42);
          fVar46 = auVar42._0_4_;
        }
        auVar21._8_4_ = 0x80000000;
        auVar21._0_8_ = 0x8000000080000000;
        auVar21._12_4_ = 0x80000000;
        auVar42 = vxorps_avx512vl(ZEXT416((uint)pcVar15[2].m_shapeType),auVar21);
        local_e4 = (1.0 / fVar46) * auVar42._0_4_;
        local_ec = (1.0 / fVar46) * *(float *)((long)&pcVar15[2]._vptr_cbtCollisionShape + 4);
        local_e0 = 0.0;
      }
      fVar46 = 0.0;
      (*pcVar14->_vptr_cbtCollisionShape[4])(pcVar14);
      auVar42 = vminss_avx(SUB6416(ZEXT464(0x3ec90fdb),0),
                           ZEXT416((uint)(gContactBreakingThreshold / fVar46)));
      auVar51 = vfmadd231ss_fma(ZEXT416((uint)(local_e4 * local_e4)),ZEXT416((uint)local_e0),
                                ZEXT416((uint)local_e0));
      auVar51 = vfmadd231ss_fma(auVar51,ZEXT416((uint)local_ec),ZEXT416((uint)local_ec));
      if (auVar51._0_4_ < 0.0) {
        fVar46 = sqrtf(auVar51._0_4_);
      }
      else {
        auVar51 = vsqrtss_avx(auVar51,auVar51);
        fVar46 = auVar51._0_4_;
      }
      fVar45 = auVar42._0_4_ * 0.5;
      fVar44 = sinf(fVar45);
      fVar45 = cosf(fVar45);
      iVar36 = this->m_numPerturbationIterations;
      if (0 < iVar36) {
        fVar44 = fVar44 / fVar46;
        local_e0 = fVar44 * local_e0;
        local_e4 = fVar44 * local_e4;
        fVar44 = fVar44 * local_ec;
        iVar34 = 0;
        do {
          fVar46 = *(float *)((long)&pcVar15[2]._vptr_cbtCollisionShape + 4);
          auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar46 * fVar46)),
                                    ZEXT416(*(uint *)&pcVar15[2]._vptr_cbtCollisionShape),
                                    ZEXT416(*(uint *)&pcVar15[2]._vptr_cbtCollisionShape));
          auVar42 = vfmadd213ss_fma(ZEXT416((uint)pcVar15[2].m_shapeType),
                                    ZEXT416((uint)pcVar15[2].m_shapeType),auVar42);
          if (auVar42._0_4_ < 0.0) {
            fVar46 = sqrtf(auVar42._0_4_);
          }
          else {
            auVar42 = vsqrtss_avx(auVar42,auVar42);
            fVar46 = auVar42._0_4_;
          }
          fVar9 = (6.2831855 / (float)iVar36) * (float)iVar34 * 0.5;
          fVar47 = sinf(fVar9);
          fVar47 = fVar47 / fVar46;
          fVar46 = fVar47 * *(float *)&pcVar15[2]._vptr_cbtCollisionShape;
          fVar10 = fVar47 * *(float *)((long)&pcVar15[2]._vptr_cbtCollisionShape + 4);
          fVar47 = fVar47 * (float)pcVar15[2].m_shapeType;
          auVar50._0_4_ = cosf(fVar9);
          auVar50._4_60_ = extraout_var;
          auVar49 = auVar50._0_16_;
          auVar42 = vfmsub231ss_fma(ZEXT416((uint)(fVar46 * fVar45)),auVar49,ZEXT416((uint)local_e0)
                                   );
          auVar42 = vfnmadd231ss_fma(auVar42,ZEXT416((uint)fVar10),ZEXT416((uint)fVar44));
          auVar51 = vfmadd231ss_fma(auVar42,ZEXT416((uint)fVar47),ZEXT416((uint)local_e4));
          auVar42 = vfmsub231ss_fma(ZEXT416((uint)(fVar10 * fVar45)),auVar49,ZEXT416((uint)local_e4)
                                   );
          auVar42 = vfnmadd231ss_fma(auVar42,ZEXT416((uint)fVar47),ZEXT416((uint)local_e0));
          auVar54 = ZEXT416((uint)fVar46);
          auVar21 = vfmadd231ss_fma(auVar42,auVar54,ZEXT416((uint)fVar44));
          auVar42 = vfmsub231ss_fma(ZEXT416((uint)(fVar47 * fVar45)),auVar49,ZEXT416((uint)fVar44));
          auVar42 = vfnmadd231ss_fma(auVar42,auVar54,ZEXT416((uint)local_e4));
          auVar22 = vfmadd231ss_fma(auVar42,ZEXT416((uint)fVar10),ZEXT416((uint)local_e0));
          auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar46 * local_e0)),auVar49,ZEXT416((uint)fVar45)
                                   );
          auVar53 = ZEXT416((uint)fVar10);
          auVar42 = vfmadd231ss_fma(auVar42,auVar53,ZEXT416((uint)local_e4));
          auVar52 = ZEXT416((uint)fVar47);
          auVar23 = vfmadd231ss_fma(auVar42,auVar52,ZEXT416((uint)fVar44));
          auVar42 = vfmadd231ss_fma(ZEXT416((uint)(auVar50._0_4_ * auVar51._0_4_)),auVar23,auVar54);
          auVar42 = vfmadd231ss_fma(auVar42,auVar21,auVar52);
          auVar24 = vfnmadd231ss_fma(auVar42,auVar22,auVar53);
          auVar42 = vfmadd231ss_fma(ZEXT416((uint)(auVar50._0_4_ * auVar21._0_4_)),auVar23,auVar53);
          auVar42 = vfmadd231ss_fma(auVar42,auVar22,auVar54);
          auVar42 = vfnmadd231ss_fma(auVar42,auVar51,auVar52);
          auVar42 = vinsertps_avx(auVar24,auVar42,0x10);
          auVar24 = vfmadd231ss_fma(ZEXT416((uint)(auVar50._0_4_ * auVar22._0_4_)),auVar23,auVar52);
          auVar24 = vfmadd231ss_fma(auVar24,auVar51,auVar53);
          auVar24 = vfnmadd231ss_fma(auVar24,auVar21,ZEXT416((uint)fVar46));
          auVar51 = vfmsub231ss_fma(ZEXT416((uint)(fVar46 * auVar51._0_4_)),auVar49,auVar23);
          auVar51 = vfnmadd231ss_fma(auVar51,auVar53,auVar21);
          auVar51 = vfnmadd231ss_fma(auVar51,auVar52,auVar22);
          auVar51 = vinsertps_avx(auVar24,auVar51,0x10);
          local_80.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar42,auVar51);
          collideSingleContact
                    (this,(cbtQuaternion *)&local_80,body0Wrap,body1Wrap,dispatchInfo_00,resultOut);
          iVar34 = iVar34 + 1;
          iVar36 = this->m_numPerturbationIterations;
        } while (iVar34 < iVar36);
      }
    }
    if (((this->m_ownManifold == true) && (this->m_manifoldPtr->m_cachedPoints != 0)) &&
       (this_00 = resultOut->m_manifoldPtr, this_00->m_cachedPoints != 0)) {
      pcVar35 = resultOut->m_body0Wrap->m_collisionObject;
      if (this_00->m_body0 == pcVar35) {
        pcVar33 = resultOut->m_body1Wrap->m_collisionObject;
      }
      else {
        pcVar33 = pcVar35;
        pcVar35 = resultOut->m_body1Wrap->m_collisionObject;
      }
      cbtPersistentManifold::refreshContactPoints
                (this_00,&pcVar35->m_worldTransform,&pcVar33->m_worldTransform);
    }
  }
  return;
}

Assistant:

void cbtConvexPlaneCollisionAlgorithm::processCollision(const cbtCollisionObjectWrapper* body0Wrap, const cbtCollisionObjectWrapper* body1Wrap, const cbtDispatcherInfo& dispatchInfo, cbtManifoldResult* resultOut)
{
	(void)dispatchInfo;
	if (!m_manifoldPtr)
		return;

	const cbtCollisionObjectWrapper* convexObjWrap = m_isSwapped ? body1Wrap : body0Wrap;
	const cbtCollisionObjectWrapper* planeObjWrap = m_isSwapped ? body0Wrap : body1Wrap;

	cbtConvexShape* convexShape = (cbtConvexShape*)convexObjWrap->getCollisionShape();
	cbtStaticPlaneShape* planeShape = (cbtStaticPlaneShape*)planeObjWrap->getCollisionShape();

	bool hasCollision = false;
	const cbtVector3& planeNormal = planeShape->getPlaneNormal();
	const cbtScalar& planeConstant = planeShape->getPlaneConstant();
	cbtTransform planeInConvex;
	planeInConvex = convexObjWrap->getWorldTransform().inverse() * planeObjWrap->getWorldTransform();
	cbtTransform convexInPlaneTrans;
	convexInPlaneTrans = planeObjWrap->getWorldTransform().inverse() * convexObjWrap->getWorldTransform();

	cbtVector3 vtx = convexShape->localGetSupportingVertex(planeInConvex.getBasis() * -planeNormal);
	cbtVector3 vtxInPlane = convexInPlaneTrans(vtx);
	cbtScalar distance = (planeNormal.dot(vtxInPlane) - planeConstant);

	cbtVector3 vtxInPlaneProjected = vtxInPlane - distance * planeNormal;
	cbtVector3 vtxInPlaneWorld = planeObjWrap->getWorldTransform() * vtxInPlaneProjected;

	hasCollision = distance < m_manifoldPtr->getContactBreakingThreshold()+ resultOut->m_closestPointDistanceThreshold;
	resultOut->setPersistentManifold(m_manifoldPtr);
	if (hasCollision)
	{
		/// report a contact. internally this will be kept persistent, and contact reduction is done
		cbtVector3 normalOnSurfaceB = planeObjWrap->getWorldTransform().getBasis() * planeNormal;
		cbtVector3 pOnB = vtxInPlaneWorld;
		resultOut->addContactPoint(normalOnSurfaceB, pOnB, distance);
	}

	//the perturbation algorithm doesn't work well with implicit surfaces such as spheres, cylinder and cones:
	//they keep on rolling forever because of the additional off-center contact points
	//so only enable the feature for polyhedral shapes (cbtBoxShape, cbtConvexHullShape etc)
	if (convexShape->isPolyhedral() && resultOut->getPersistentManifold()->getNumContacts() < m_minimumPointsPerturbationThreshold)
	{
		cbtVector3 v0, v1;
		cbtPlaneSpace1(planeNormal, v0, v1);
		//now perform 'm_numPerturbationIterations' collision queries with the perturbated collision objects

		const cbtScalar angleLimit = 0.125f * SIMD_PI;
		cbtScalar perturbeAngle;
		cbtScalar radius = convexShape->getAngularMotionDisc();
		perturbeAngle = gContactBreakingThreshold / radius;
		if (perturbeAngle > angleLimit)
			perturbeAngle = angleLimit;

		cbtQuaternion perturbeRot(v0, perturbeAngle);
		for (int i = 0; i < m_numPerturbationIterations; i++)
		{
			cbtScalar iterationAngle = i * (SIMD_2_PI / cbtScalar(m_numPerturbationIterations));
			cbtQuaternion rotq(planeNormal, iterationAngle);
			collideSingleContact(rotq.inverse() * perturbeRot * rotq, body0Wrap, body1Wrap, dispatchInfo, resultOut);
		}
	}

	if (m_ownManifold)
	{
		if (m_manifoldPtr->getNumContacts())
		{
			resultOut->refreshContactPoints();
		}
	}
}